

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

call_modifier<trompeloeil::call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>,_GenericOperation2Mock<int,_int,_int>::trompeloeil_l_tag_type_trompeloeil_60,_trompeloeil::sequence_injector<trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(int,_int)>_>_>_>
 __thiscall
trompeloeil::
call_modifier<trompeloeil::call_matcher<int(int,int),std::tuple<trompeloeil::wildcard,trompeloeil::wildcard>>,GenericOperation2Mock<int,int,int>::trompeloeil_l_tag_type_trompeloeil_60,trompeloeil::return_injector<int,trompeloeil::matcher_info<int(int,int)>>>
::in_sequence<std::pair<char_const*,trompeloeil::sequence&>,false>
          (call_modifier<trompeloeil::call_matcher<int(int,int),std::tuple<trompeloeil::wildcard,trompeloeil::wildcard>>,GenericOperation2Mock<int,int,int>::trompeloeil_l_tag_type_trompeloeil_60,trompeloeil::return_injector<int,trompeloeil::matcher_info<int(int,int)>>>
           *this,pair<const_char_*,_trompeloeil::sequence_&> *t)

{
  pair<const_char_*,_trompeloeil::sequence_&> *t_local;
  call_modifier<trompeloeil::call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>,_GenericOperation2Mock<int,_int,_int>::trompeloeil_l_tag_type_trompeloeil_60,_trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(int,_int)>_>_>
  *this_local;
  
  call_matcher<int(int,int),std::tuple<trompeloeil::wildcard,trompeloeil::wildcard>>::
  set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
            (*(call_matcher<int(int,int),std::tuple<trompeloeil::wildcard,trompeloeil::wildcard>> **
              )this,t);
  call_modifier<trompeloeil::call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>,_GenericOperation2Mock<int,_int,_int>::trompeloeil_l_tag_type_trompeloeil_60,_trompeloeil::sequence_injector<trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(int,_int)>_>_>_>
  ::call_modifier((call_modifier<trompeloeil::call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>,_GenericOperation2Mock<int,_int,_int>::trompeloeil_l_tag_type_trompeloeil_60,_trompeloeil::sequence_injector<trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(int,_int)>_>_>_>
                   *)&this_local,
                  *(call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>
                    **)this);
  return (call_modifier<trompeloeil::call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>,_GenericOperation2Mock<int,_int,_int>::trompeloeil_l_tag_type_trompeloeil_60,_trompeloeil::sequence_injector<trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(int,_int)>_>_>_>
          )(call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>
            *)this_local;
}

Assistant:

call_modifier<Matcher, modifier_tag, sequence_injector<Parent>>
    in_sequence(
      T&& ... t)
    {
      static_assert(!b,
                    "Multiple IN_SEQUENCE does not make sense."
                    " You can list several sequence objects at once");

      static_assert(upper_call_limit > 0,
                    "IN_SEQUENCE for forbidden call does not make sense");

      matcher->set_sequence(std::forward<T>(t)...);
      return {matcher};
    }